

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

cbtHullTriangle * ConvexDecomposition::extrudable(float epsilon)

{
  float fVar1;
  cbtHullTriangle **ppcVar2;
  cbtHullTriangle *pcVar3;
  int i;
  cbtHullTriangle *pcVar4;
  
  i = 0;
  pcVar4 = (cbtHullTriangle *)0x0;
  do {
    if ((int)tris._8_4_ <= i) {
      pcVar3 = (cbtHullTriangle *)0x0;
      if (epsilon < pcVar4->rise) {
        pcVar3 = pcVar4;
      }
      return pcVar3;
    }
    if (pcVar4 == (cbtHullTriangle *)0x0) {
LAB_00e2a492:
      ppcVar2 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                          ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,i);
      pcVar4 = *ppcVar2;
    }
    else {
      ppcVar2 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                          ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,i);
      if (*ppcVar2 != (cbtHullTriangle *)0x0) {
        fVar1 = pcVar4->rise;
        ppcVar2 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                            ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,i);
        if (fVar1 < (*ppcVar2)->rise) goto LAB_00e2a492;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

cbtHullTriangle *extrudable(float epsilon)
{
	int i;
	cbtHullTriangle *t=NULL;
	for(i=0;i<tris.count;i++)
	{
		if(!t || (tris[i] && t->rise<tris[i]->rise))
		{
			t = tris[i];
		}
	}
	return (t->rise >epsilon)?t:NULL ;
}